

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPass.cpp
# Opt level: O2

void __thiscall
myvk::RenderPassState::RegisterAttachment
          (RenderPassState *this,uint32_t attachment,char *attachment_str,VkFormat format,
          VkImageLayout initial_layout,VkImageLayout final_layout,VkSampleCountFlagBits samples,
          VkAttachmentLoadOp load_op,VkAttachmentStoreOp store_op,VkAttachmentLoadOp stencil_load_op
          ,VkAttachmentStoreOp stencil_store_op)

{
  long lVar1;
  long lVar2;
  uint32_t local_64;
  char *local_60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_58;
  
  local_64 = attachment;
  local_60 = attachment_str;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*&,_unsigned_int_&,_true>(&local_58,&local_60,&local_64);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              *)(this + 0x30),&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  lVar1 = *(long *)(this + 0x60);
  lVar2 = (ulong)local_64 * 0x24;
  *(undefined4 *)(lVar1 + lVar2) = 0;
  *(VkFormat *)(lVar1 + 4 + lVar2) = format;
  *(VkImageLayout *)(lVar1 + 0x1c + lVar2) = initial_layout;
  *(VkImageLayout *)(lVar1 + 0x20 + lVar2) = final_layout;
  *(VkSampleCountFlagBits *)(lVar1 + 8 + lVar2) = samples;
  *(VkAttachmentLoadOp *)(lVar1 + 0xc + lVar2) = load_op;
  *(VkAttachmentStoreOp *)(lVar1 + 0x10 + lVar2) = store_op;
  *(VkAttachmentLoadOp *)(lVar1 + 0x14 + lVar2) = stencil_load_op;
  *(VkAttachmentStoreOp *)(lVar1 + 0x18 + lVar2) = stencil_store_op;
  return;
}

Assistant:

void RenderPassState::RegisterAttachment(uint32_t attachment, const char *attachment_str, VkFormat format,
                                         VkImageLayout initial_layout, VkImageLayout final_layout,
                                         VkSampleCountFlagBits samples, VkAttachmentLoadOp load_op,
                                         VkAttachmentStoreOp store_op, VkAttachmentLoadOp stencil_load_op,
                                         VkAttachmentStoreOp stencil_store_op) {
	assert(attachment < get_attachment_count());
	assert(m_attachment_map.find(attachment_str) == m_attachment_map.end());
	assert(m_attachment_descriptions[attachment].flags == VK_ATTACHMENT_DESCRIPTION_FLAG_BITS_MAX_ENUM);

	m_attachment_map.insert({attachment_str, attachment});
	VkAttachmentDescription &des = m_attachment_descriptions[attachment];
	des.flags = 0; // TODO: attachment description flags ?
	des.format = format;
	des.initialLayout = initial_layout;
	des.finalLayout = final_layout;
	des.samples = samples;
	des.loadOp = load_op;
	des.storeOp = store_op;
	des.stencilLoadOp = stencil_load_op;
	des.stencilStoreOp = stencil_store_op;
}